

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O0

void __thiscall BOWFileParser::readBOWFile(BOWFileParser *this)

{
  bool bVar1;
  ulong uVar2;
  istream *piVar3;
  size_type sVar4;
  value_type_conflict1 local_210;
  int local_20c;
  undefined4 local_208;
  int j_1;
  istringstream local_200 [4];
  int j;
  istringstream stream;
  string local_80 [8];
  string token;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> intVec;
  int local_34;
  string local_30 [4];
  int i;
  string str;
  BOWFileParser *this_local;
  
  uVar2 = std::ios::operator!((ios *)(&this->_inputText + *(long *)(*(long *)this + -0x18)));
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_30);
    local_34 = 0;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)this,local_30);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      std::__cxx11::string::string(local_80);
      std::__cxx11::istringstream::istringstream(local_200,local_30,_S_in);
      if (local_34 == 0) {
        j_1 = 0;
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_200,local_80,',');
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          if (j_1 != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->_wordList,(value_type *)local_80);
          }
          j_1 = j_1 + 1;
        }
        local_208 = 4;
      }
      else {
        local_20c = 0;
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_200,local_80,',');
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
          if (!bVar1) break;
          if (local_20c != 0) {
            local_210 = std::__cxx11::stoi((string *)local_80,(size_t *)0x0,10);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,&local_210);
          }
          local_20c = local_20c + 1;
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::push_back(&this->_frequencyMatrix,(value_type *)local_60);
        local_208 = 0;
      }
      std::__cxx11::istringstream::~istringstream(local_200);
      std::__cxx11::string::~string(local_80);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      local_34 = local_34 + 1;
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_wordList);
    this->_V = (uint)sVar4;
    std::__cxx11::string::~string(local_30);
    return;
  }
  std::operator<<((ostream *)&std::cout,"Cannot open BOWfile");
  exit(1);
}

Assistant:

void BOWFileParser::readBOWFile(){//{{{
    if(!_inputText){
        cout<<"Cannot open BOWfile";
        exit(1);
    }
    string str;
    for(int i=0;getline(_inputText,str);i++){
        vector<unsigned int > intVec;
        string token;
        istringstream stream(str);

        if(i==0){
            for(int j=0;getline(stream,token,',');j++){
                if(j==0)continue;
                _wordList.push_back(token);
            }
            continue;
        }
        for(int j=0;getline(stream,token,',');j++){
            if(j==0)continue;
            intVec.push_back(stoi(token));
        }
        _frequencyMatrix.push_back(intVec);
    }

    _V = _wordList.size();
}